

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetImplicit(void *arkode_mem)

{
  int iVar1;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (ARKodeARKStepMem *)0x1124fa4);
  if (local_4 == 0) {
    if (*(long *)(in_stack_ffffffffffffffe0 + 8) == 0) {
      arkProcessError(in_stack_ffffffffffffffe8,-0x16,"ARKode::ARKStep","ARKStepSetImplicit",
                      "Cannot specify that method is implicit without providing a function pointer to fi(t,y)."
                     );
      local_4 = -0x16;
    }
    else {
      in_stack_ffffffffffffffe0[0x1c] = '\x01';
      in_stack_ffffffffffffffe0[0x1d] = '\0';
      in_stack_ffffffffffffffe0[0x1e] = '\0';
      in_stack_ffffffffffffffe0[0x1f] = '\0';
      in_stack_ffffffffffffffe0[0x18] = '\0';
      in_stack_ffffffffffffffe0[0x19] = '\0';
      in_stack_ffffffffffffffe0[0x1a] = '\0';
      in_stack_ffffffffffffffe0[0x1b] = '\0';
      if (in_stack_ffffffffffffffe8->user_efun == 0) {
        if ((in_stack_ffffffffffffffe8->itol == 1) &&
           (in_stack_ffffffffffffffe8->Vabstol != (N_Vector)0x0)) {
          iVar1 = arkSVtolerances(in_stack_ffffffffffffffe8,(realtype)in_stack_ffffffffffffffe0,
                                  (N_Vector)(ulong)in_stack_ffffffffffffffd8);
        }
        else {
          iVar1 = arkSStolerances(in_stack_ffffffffffffffe8,(realtype)in_stack_ffffffffffffffe0,
                                  (realtype)(ulong)in_stack_ffffffffffffffd8);
        }
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetImplicit(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetImplicit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* ensure that fi is defined */
  if (step_mem->fi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetImplicit", MSG_ARK_MISSING_FI);
    return(ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->implicit = SUNTRUE;
  step_mem->explicit = SUNFALSE;

  /* re-attach internal error weight functions if necessary */
  if (!ark_mem->user_efun) {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
      retval = arkSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    else
      retval = arkSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    if (retval != ARK_SUCCESS) return(retval);
  }

  return(ARK_SUCCESS);
}